

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_meshb_keyword(REF_CELL ref_cell,REF_INT *keyword)

{
  REF_INT *keyword_local;
  REF_CELL ref_cell_local;
  
  switch(ref_cell->type) {
  case REF_CELL_EDG:
    *keyword = 5;
    break;
  case REF_CELL_ED2:
    *keyword = 0x19;
    break;
  case REF_CELL_ED3:
    *keyword = 0x5c;
    break;
  case REF_CELL_TRI:
    *keyword = 6;
    break;
  case REF_CELL_TR2:
    *keyword = 0x18;
    break;
  case REF_CELL_TR3:
    *keyword = 0x5a;
    break;
  case REF_CELL_QUA:
    *keyword = 7;
    break;
  case REF_CELL_QU2:
    *keyword = 0x1b;
    break;
  case REF_CELL_TET:
    *keyword = 8;
    break;
  case REF_CELL_PYR:
    *keyword = 0x31;
    break;
  case REF_CELL_PRI:
    *keyword = 9;
    break;
  case REF_CELL_HEX:
    *keyword = 10;
    break;
  case REF_CELL_TE2:
    *keyword = 0x1e;
    break;
  case REF_CELL_PY2:
    *keyword = 0x57;
    break;
  case REF_CELL_PR2:
    *keyword = 0x56;
    break;
  case REF_CELL_HE2:
    *keyword = 0x21;
    break;
  default:
    return 6;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_meshb_keyword(REF_CELL ref_cell, REF_INT *keyword) {
  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
      *keyword = 5;
      break;
    case REF_CELL_ED2:
      *keyword = 25;
      break;
    case REF_CELL_ED3:
      *keyword = 92;
      break;
    case REF_CELL_TRI:
      *keyword = 6;
      break;
    case REF_CELL_TR2:
      *keyword = 24;
      break;
    case REF_CELL_TR3:
      *keyword = 90;
      break;
    case REF_CELL_QUA:
      *keyword = 7;
      break;
    case REF_CELL_QU2:
      *keyword = 27;
      break;
    case REF_CELL_TET:
      *keyword = 8;
      break;
    case REF_CELL_PYR:
      *keyword = 49;
      break;
    case REF_CELL_PRI:
      *keyword = 9;
      break;
    case REF_CELL_HEX:
      *keyword = 10;
      break;
    case REF_CELL_TE2:
      *keyword = 30;
      break;
    case REF_CELL_PY2:
      *keyword = 87;
      break;
    case REF_CELL_PR2:
      *keyword = 86;
      break;
    case REF_CELL_HE2:
      *keyword = 33;
      break;
    default:
      return REF_IMPLEMENT;
  }
  return REF_SUCCESS;
}